

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodemv.c
# Opt level: O0

PREDICTION_MODE read_inter_mode(FRAME_CONTEXT *ec_ctx,aom_reader *r,int16_t ctx)

{
  int iVar1;
  uint uVar2;
  short in_DX;
  int is_refmv;
  int is_zeromv;
  int is_newmv;
  int16_t mode_ctx;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined1 local_1;
  
  iVar1 = aom_read_symbol_((aom_reader *)
                           (CONCAT26(in_DX,CONCAT24(in_DX,in_stack_ffffffffffffffe0)) &
                           0xffff0007ffffffff),
                           (aom_cdf_prob *)
                           CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),0);
  uVar2 = (uint)(iVar1 == 0);
  if (uVar2 == 0) {
    iVar1 = aom_read_symbol_((aom_reader *)
                             (((ulong)CONCAT22(in_DX,in_DX >> 3) & 0xffff0001) << 0x20),
                             (aom_cdf_prob *)
                             CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),0);
    if (iVar1 == 0) {
      local_1 = '\x0f';
    }
    else {
      iVar1 = aom_read_symbol_((aom_reader *)
                               (CONCAT26(in_DX,CONCAT24(in_DX >> 4,uVar2)) & 0xffff000fffffffff),
                               (aom_cdf_prob *)(ulong)CONCAT14(iVar1 == 0,in_stack_ffffffffffffffd8)
                               ,0);
      if (iVar1 == 0) {
        local_1 = '\r';
      }
      else {
        local_1 = '\x0e';
      }
    }
  }
  else {
    local_1 = '\x10';
  }
  return local_1;
}

Assistant:

static PREDICTION_MODE read_inter_mode(FRAME_CONTEXT *ec_ctx, aom_reader *r,
                                       int16_t ctx) {
  int16_t mode_ctx = ctx & NEWMV_CTX_MASK;
  int is_newmv, is_zeromv, is_refmv;
  is_newmv = aom_read_symbol(r, ec_ctx->newmv_cdf[mode_ctx], 2, ACCT_STR) == 0;
  if (is_newmv) return NEWMV;

  mode_ctx = (ctx >> GLOBALMV_OFFSET) & GLOBALMV_CTX_MASK;
  is_zeromv =
      aom_read_symbol(r, ec_ctx->zeromv_cdf[mode_ctx], 2, ACCT_STR) == 0;
  if (is_zeromv) return GLOBALMV;

  mode_ctx = (ctx >> REFMV_OFFSET) & REFMV_CTX_MASK;
  is_refmv = aom_read_symbol(r, ec_ctx->refmv_cdf[mode_ctx], 2, ACCT_STR) == 0;
  if (is_refmv)
    return NEARESTMV;
  else
    return NEARMV;
}